

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsOutput::assume(SmodelsOutput *this,LitSpan *lits)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  int *piVar4;
  
  iVar1 = this->sec_;
  if (1 < iVar1) {
    fail(-2,"virtual void Potassco::SmodelsOutput::assume(const LitSpan &)",0x164,"sec_ < 2",
         "at most one compute statement supported in smodels format",0);
  }
  while (iVar1 != 2) {
    startRule(this,0);
    endRule(this);
    iVar1 = this->sec_ + 1;
    this->sec_ = iVar1;
  }
  std::operator<<(this->os_,"B+\n");
  piVar3 = lits->first;
  for (piVar4 = piVar3; piVar4 != piVar3 + lits->size; piVar4 = piVar4 + 1) {
    if (0 < *piVar4) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
      std::operator<<(poVar2,"\n");
      piVar3 = lits->first;
    }
  }
  std::operator<<(this->os_,"0\nB-\n");
  piVar3 = lits->first;
  for (piVar4 = piVar3; piVar4 != piVar3 + lits->size; piVar4 = piVar4 + 1) {
    if (*piVar4 < 0) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
      std::operator<<(poVar2,"\n");
      piVar3 = lits->first;
    }
  }
  if ((this->fHead_ != false) && (this->false_ != 0)) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this->os_);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<(this->os_,"0\n");
  return;
}

Assistant:

void SmodelsOutput::assume(const LitSpan& lits) {
	POTASSCO_REQUIRE(sec_ < 2, "at most one compute statement supported in smodels format");
	while (sec_ != 2) { startRule(End).endRule(); ++sec_; }
	os_ << "B+\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) > 0) { os_ << atom(*x) << "\n"; }
	}
	os_ << "0\nB-\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) < 0) { os_ << atom(*x) << "\n"; }
	}
	if (fHead_ && false_) {
		os_ << false_ << "\n";
	}
	os_ << "0\n";
}